

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::HandlePackageMode(cmFindPackageCommand *this)

{
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *this_00;
  string *name;
  cmMakefile *pcVar1;
  pointer pCVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  string *__lhs;
  ostream *poVar8;
  const_iterator cVar9;
  string *s;
  pointer pCVar10;
  byte bVar11;
  ConfigFileInfo *pCVar12;
  bool local_468;
  allocator<char> local_463;
  allocator<char> local_462;
  allocator<char> local_461;
  string consideredVersionsVar;
  string foundVar;
  string consideredVersions;
  string consideredConfigFiles;
  string notFoundMessage;
  string notFoundMessageVar;
  string local_3a0;
  string local_380;
  string upperFound;
  string upperDir;
  string fileVar;
  string consideredConfigsVar;
  
  this_00 = &this->ConsideredConfigs;
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::clear(this_00);
  s = &this->Name;
  cmsys::SystemTools::UpperCase(&upperDir,s);
  cmsys::SystemTools::UpperCase(&upperFound,s);
  std::__cxx11::string::append((char *)&upperDir);
  std::__cxx11::string::append((char *)&upperFound);
  name = &this->Variable;
  pcVar7 = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,name);
  if (this->UseConfigFiles == true) {
    bVar4 = cmSystemTools::IsOff(pcVar7);
    if (bVar4) {
      bVar4 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileVar,pcVar7,(allocator<char> *)&consideredConfigsVar);
      cmsys::SystemTools::ConvertToUnixSlashes(&fileVar);
      bVar4 = cmsys::SystemTools::FileIsFullPath(&fileVar);
      if (!bVar4) {
        std::operator+(&consideredConfigsVar,"/",&fileVar);
        std::__cxx11::string::operator=((string *)&fileVar,(string *)&consideredConfigsVar);
        std::__cxx11::string::~string((string *)&consideredConfigsVar);
        __lhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                          ((this->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+(&consideredConfigsVar,__lhs,&fileVar);
        std::__cxx11::string::operator=((string *)&fileVar,(string *)&consideredConfigsVar);
        std::__cxx11::string::~string((string *)&consideredConfigsVar);
      }
      consideredConfigsVar._M_dataplus._M_p = (pointer)&consideredConfigsVar.field_2;
      consideredConfigsVar._M_string_length = 0;
      consideredConfigsVar.field_2._M_local_buf[0] = '\0';
      bVar4 = FindConfigFile(this,&fileVar,&consideredConfigsVar);
      if (bVar4) {
        std::__cxx11::string::_M_assign((string *)&this->FileFound);
      }
      pcVar7 = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,name);
      std::__cxx11::string::~string((string *)&consideredConfigsVar);
      std::__cxx11::string::~string((string *)&fileVar);
    }
    bVar5 = cmSystemTools::IsOff(pcVar7);
    if ((bVar5) || (bVar4 == false)) {
      bVar4 = FindConfig(this);
    }
    if ((bVar4 != false) && ((this->FileFound)._M_string_length == 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileVar,"fileFound is true but FileFound is empty!",
                 (allocator<char> *)&consideredConfigsVar);
      cmMakefile::IssueMessage(pcVar1,INTERNAL_ERROR,&fileVar);
      std::__cxx11::string::~string((string *)&fileVar);
      goto LAB_00201f0a;
    }
  }
  else {
LAB_00201f0a:
    bVar4 = false;
  }
  std::__cxx11::string::string((string *)&foundVar,(string *)s);
  std::__cxx11::string::append((char *)&foundVar);
  std::__cxx11::string::string((string *)&notFoundMessageVar,(string *)s);
  std::__cxx11::string::append((char *)&notFoundMessageVar);
  notFoundMessage._M_dataplus._M_p = (pointer)&notFoundMessage.field_2;
  notFoundMessage._M_string_length = 0;
  notFoundMessage.field_2._M_local_buf[0] = '\0';
  if (bVar4 != false) {
    bVar5 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&foundVar);
    if ((bVar5) &&
       (bVar5 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&foundVar),
       !bVar5)) {
      cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&foundVar);
    }
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,&notFoundMessageVar);
    StoreVersionFound(this);
    bVar5 = ReadListFile(this,&this->FileFound,DoPolicyScope);
    if (!bVar5) {
      pcVar7 = "0";
      bVar5 = false;
      local_468 = false;
      goto LAB_0020278e;
    }
    bVar6 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&foundVar);
    pcVar7 = "1";
    bVar5 = true;
    if (!bVar6) {
      local_468 = true;
      goto LAB_0020278e;
    }
    bVar6 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&foundVar);
    local_468 = true;
    if (bVar6) goto LAB_0020278e;
    cmMakefile::GetSafeDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,&notFoundMessageVar);
    std::__cxx11::string::_M_assign((string *)&notFoundMessage);
  }
  if (this->Required == false) {
    if (this->Quiet == false) {
      if (((this->UseConfigFiles != true) || (this->UseFindModules != false)) ||
         ((this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00202060;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fileVar);
      poVar8 = std::operator<<((ostream *)&fileVar,"Could NOT find ");
      poVar8 = std::operator<<(poVar8,(string *)s);
      poVar8 = std::operator<<(poVar8," (missing: ");
      poVar8 = std::operator<<(poVar8,(string *)s);
      std::operator<<(poVar8,"_DIR)");
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::DisplayStatus(pcVar1,&consideredConfigsVar,-1.0);
      std::__cxx11::string::~string((string *)&consideredConfigsVar);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileVar);
    }
  }
  else {
LAB_00202060:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fileVar);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&consideredConfigsVar);
    if (bVar4 == false) {
      if ((this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->ConsideredConfigs).
          super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        consideredVersionsVar._M_dataplus._M_p = (pointer)&consideredVersionsVar.field_2;
        consideredVersionsVar._M_string_length = 0;
        consideredVersionsVar.field_2._M_local_buf[0] = '\0';
        if ((this->Version)._M_string_length != 0) {
          std::__cxx11::string::assign((char *)&consideredVersionsVar);
          std::__cxx11::string::append((string *)&consideredVersionsVar);
          std::__cxx11::string::append((char *)&consideredVersionsVar);
        }
        if (this->UseConfigFiles == true) {
          if (this->UseFindModules == true) {
            poVar8 = std::operator<<((ostream *)&fileVar,"By not providing \"Find");
            poVar8 = std::operator<<(poVar8,(string *)s);
            poVar8 = std::operator<<(poVar8,
                                     ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                                    );
            poVar8 = std::operator<<(poVar8,(string *)s);
            std::operator<<(poVar8,"\", but CMake did not find one.\n");
          }
          if ((long)(this->Configs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->Configs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x20) {
            poVar8 = std::operator<<((ostream *)&fileVar,
                                     "Could not find a package configuration file named \"");
            poVar8 = std::operator<<(poVar8,(string *)
                                            (this->Configs).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
            poVar8 = std::operator<<(poVar8,"\" provided by package \"");
            poVar8 = std::operator<<(poVar8,(string *)s);
            poVar8 = std::operator<<(poVar8,"\"");
            poVar8 = std::operator<<(poVar8,(string *)&consideredVersionsVar);
            std::operator<<(poVar8,".\n");
          }
          else {
            poVar8 = std::operator<<((ostream *)&fileVar,
                                     "Could not find a package configuration file provided by \"");
            poVar8 = std::operator<<(poVar8,(string *)s);
            poVar8 = std::operator<<(poVar8,"\"");
            poVar8 = std::operator<<(poVar8,(string *)&consideredVersionsVar);
            poVar8 = std::operator<<(poVar8," with any of the following names:\n");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&consideredVersions,"  ",&local_461);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"",&local_462);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"\n",&local_463)
            ;
            cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&consideredConfigFiles,&consideredVersions,&this->Configs,&local_380,
                       &local_3a0);
            poVar8 = std::operator<<(poVar8,(string *)&consideredConfigFiles);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&consideredConfigFiles);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_380);
            std::__cxx11::string::~string((string *)&consideredVersions);
          }
          poVar8 = std::operator<<((ostream *)&fileVar,"Add the installation prefix of \"");
          poVar8 = std::operator<<(poVar8,(string *)s);
          poVar8 = std::operator<<(poVar8,"\" to CMAKE_PREFIX_PATH or set \"");
          poVar8 = std::operator<<(poVar8,(string *)name);
          poVar8 = std::operator<<(poVar8,
                                   "\" to a directory containing one of the above files. If \"");
          poVar8 = std::operator<<(poVar8,(string *)s);
          pcVar7 = 
          "\" provides a separate development package or SDK, be sure it has been installed.";
        }
        else {
          poVar8 = std::operator<<((ostream *)&fileVar,"No \"Find");
          poVar8 = std::operator<<(poVar8,(string *)s);
          poVar8 = std::operator<<(poVar8,".cmake\" found in ");
          std::operator<<(poVar8,"CMAKE_MODULE_PATH.");
          poVar8 = std::operator<<((ostream *)&consideredConfigsVar,"Find");
          poVar8 = std::operator<<(poVar8,(string *)s);
          poVar8 = std::operator<<(poVar8,
                                   ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                                  );
          poVar8 = std::operator<<(poVar8,(string *)s);
          pcVar7 = 
          ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
          ;
        }
        std::operator<<(poVar8,pcVar7);
        std::__cxx11::string::~string((string *)&consideredVersionsVar);
      }
      else {
        cVar9 = cmRemoveDuplicates<std::vector<cmFindPackageCommand::ConfigFileInfo,std::allocator<cmFindPackageCommand::ConfigFileInfo>>>
                          (this_00);
        poVar8 = std::operator<<((ostream *)&fileVar,
                                 "Could not find a configuration file for package \"");
        poVar8 = std::operator<<(poVar8,(string *)s);
        poVar8 = std::operator<<(poVar8,"\" that ");
        pcVar7 = "is compatible with";
        if (this->VersionExact != false) {
          pcVar7 = "exactly matches";
        }
        poVar8 = std::operator<<(poVar8,pcVar7);
        poVar8 = std::operator<<(poVar8," requested version \"");
        poVar8 = std::operator<<(poVar8,(string *)&this->Version);
        poVar8 = std::operator<<(poVar8,"\".\n");
        std::operator<<(poVar8,
                        "The following configuration files were considered but not accepted:\n");
        for (pCVar12 = (this_00->
                       super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start; pCVar12 != cVar9._M_current;
            pCVar12 = pCVar12 + 1) {
          poVar8 = std::operator<<((ostream *)&fileVar,"  ");
          poVar8 = std::operator<<(poVar8,(string *)pCVar12);
          poVar8 = std::operator<<(poVar8,", version: ");
          poVar8 = std::operator<<(poVar8,(string *)&pCVar12->version);
          std::operator<<(poVar8,"\n");
        }
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&fileVar,"Found package configuration file:\n  ");
      poVar8 = std::operator<<(poVar8,(string *)&this->FileFound);
      poVar8 = std::operator<<(poVar8,"\nbut it set ");
      poVar8 = std::operator<<(poVar8,(string *)&foundVar);
      poVar8 = std::operator<<(poVar8," to FALSE so package \"");
      poVar8 = std::operator<<(poVar8,(string *)s);
      std::operator<<(poVar8,"\" is considered to be NOT FOUND.");
      if (notFoundMessage._M_string_length != 0) {
        poVar8 = std::operator<<((ostream *)&fileVar," Reason given by package: \n");
        poVar8 = std::operator<<(poVar8,(string *)&notFoundMessage);
        std::operator<<(poVar8,"\n");
      }
    }
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    bVar4 = this->Required;
    std::__cxx11::stringbuf::str();
    bVar11 = bVar4 ^ 1;
    cmMakefile::IssueMessage
              (pcVar1,(uint)bVar11 + (uint)bVar11 * 2 + FATAL_ERROR,&consideredVersionsVar);
    std::__cxx11::string::~string((string *)&consideredVersionsVar);
    if (this->Required == true) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
    std::__cxx11::stringbuf::str();
    sVar3 = consideredVersionsVar._M_string_length;
    std::__cxx11::string::~string((string *)&consideredVersionsVar);
    if (sVar3 != 0) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&consideredVersionsVar);
      std::__cxx11::string::~string((string *)&consideredVersionsVar);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&consideredConfigsVar);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileVar);
  }
  local_468 = true;
  pcVar7 = "0";
  bVar5 = false;
LAB_0020278e:
  cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&foundVar,pcVar7);
  std::__cxx11::string::string((string *)&fileVar,(string *)s);
  std::__cxx11::string::append((char *)&fileVar);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  if (bVar5) {
    cmMakefile::AddDefinition(pcVar1,&fileVar,(this->FileFound)._M_dataplus._M_p);
  }
  else {
    cmMakefile::RemoveDefinition(pcVar1,&fileVar);
  }
  std::__cxx11::string::string((string *)&consideredConfigsVar,(string *)s);
  std::__cxx11::string::append((char *)&consideredConfigsVar);
  std::__cxx11::string::string((string *)&consideredVersionsVar,(string *)s);
  std::__cxx11::string::append((char *)&consideredVersionsVar);
  consideredConfigFiles._M_dataplus._M_p = (pointer)&consideredConfigFiles.field_2;
  consideredConfigFiles._M_string_length = 0;
  consideredVersions._M_dataplus._M_p = (pointer)&consideredVersions.field_2;
  consideredVersions._M_string_length = 0;
  consideredConfigFiles.field_2._M_local_buf[0] = '\0';
  consideredVersions.field_2._M_local_buf[0] = '\0';
  pCVar2 = (this->ConsideredConfigs).
           super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar10 = (this->ConsideredConfigs).
                 super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar2; pCVar10 = pCVar10 + 1
      ) {
    std::__cxx11::string::append((char *)&consideredConfigFiles);
    std::__cxx11::string::append((char *)&consideredVersions);
    std::__cxx11::string::append((string *)&consideredConfigFiles);
    std::__cxx11::string::append((string *)&consideredVersions);
  }
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,&consideredConfigsVar,
             consideredConfigFiles._M_dataplus._M_p);
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,&consideredVersionsVar,
             consideredVersions._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&consideredVersions);
  std::__cxx11::string::~string((string *)&consideredConfigFiles);
  std::__cxx11::string::~string((string *)&consideredVersionsVar);
  std::__cxx11::string::~string((string *)&consideredConfigsVar);
  std::__cxx11::string::~string((string *)&fileVar);
  std::__cxx11::string::~string((string *)&notFoundMessage);
  std::__cxx11::string::~string((string *)&notFoundMessageVar);
  std::__cxx11::string::~string((string *)&foundVar);
  std::__cxx11::string::~string((string *)&upperFound);
  std::__cxx11::string::~string((string *)&upperDir);
  return local_468;
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode()
{
  this->ConsideredConfigs.clear();

  // Support old capitalization behavior.
  std::string upperDir = cmSystemTools::UpperCase(this->Name);
  std::string upperFound = cmSystemTools::UpperCase(this->Name);
  upperDir += "_DIR";
  upperFound += "_FOUND";

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles) {
    if (!cmSystemTools::IsOff(def)) {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if (!cmSystemTools::FileIsFullPath(dir)) {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
      }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file)) {
        this->FileFound = file;
        fileFound = true;
      }
      def = this->Makefile->GetDefinition(this->Variable);
    }

    // Search for the config file if it is not already found.
    if (cmSystemTools::IsOff(def) || !fileFound) {
      fileFound = this->FindConfig();
    }

    // Sanity check.
    if (fileFound && this->FileFound.empty()) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "fileFound is true but FileFound is empty!");
      fileFound = false;
    }
  }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if (fileFound) {
    if (this->Makefile->IsDefinitionSet(foundVar) &&
        !this->Makefile->IsOn(foundVar)) {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
    }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if (this->ReadListFile(this->FileFound, DoPolicyScope)) {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage =
          this->Makefile->GetSafeDefinition(notFoundMessageVar);
      }
    } else {
      // The configuration file is invalid.
      result = false;
    }
  }

  // package not found
  if (result && !found) {
    // warn if package required or neither quiet nor in config mode
    if (this->Required ||
        !(this->Quiet ||
          (this->UseConfigFiles && !this->UseFindModules &&
           this->ConsideredConfigs.empty()))) {
      // The variable is not set.
      std::ostringstream e;
      std::ostringstream aw;
      if (configFileSetFOUNDFalse) {
        /* clang-format off */
        e << "Found package configuration file:\n"
          "  " << this->FileFound << "\n"
          "but it set " << foundVar << " to FALSE so package \"" <<
          this->Name << "\" is considered to be NOT FOUND.";
        /* clang-format on */
        if (!notFoundMessage.empty()) {
          e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
      // If there are files in ConsideredConfigs, it means that FooConfig.cmake
      // have been found, but they didn't have appropriate versions.
      else if (!this->ConsideredConfigs.empty()) {
        std::vector<ConfigFileInfo>::const_iterator duplicate_end =
          cmRemoveDuplicates(this->ConsideredConfigs);
        e << "Could not find a configuration file for package \"" << this->Name
          << "\" that "
          << (this->VersionExact ? "exactly matches" : "is compatible with")
          << " requested version \"" << this->Version << "\".\n"
          << "The following configuration files were considered but not "
             "accepted:\n";

        for (ConfigFileInfo const& info :
             cmMakeRange(this->ConsideredConfigs.cbegin(), duplicate_end)) {
          e << "  " << info.filename << ", version: " << info.version << "\n";
        }
      } else {
        std::string requestedVersionString;
        if (!this->Version.empty()) {
          requestedVersionString = " (requested version ";
          requestedVersionString += this->Version;
          requestedVersionString += ")";
        }

        if (this->UseConfigFiles) {
          if (this->UseFindModules) {
            e << "By not providing \"Find" << this->Name
              << ".cmake\" in "
                 "CMAKE_MODULE_PATH this project has asked CMake to find a "
                 "package configuration file provided by \""
              << this->Name
              << "\", "
                 "but CMake did not find one.\n";
          }

          if (this->Configs.size() == 1) {
            e << "Could not find a package configuration file named \""
              << this->Configs[0] << "\" provided by package \"" << this->Name
              << "\"" << requestedVersionString << ".\n";
          } else {
            e << "Could not find a package configuration file provided by \""
              << this->Name << "\"" << requestedVersionString
              << " with any of the following names:\n"
              << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

          e << "Add the installation prefix of \"" << this->Name
            << "\" to "
               "CMAKE_PREFIX_PATH or set \""
            << this->Variable
            << "\" to a "
               "directory containing one of the above files. "
               "If \""
            << this->Name
            << "\" provides a separate development "
               "package or SDK, be sure it has been installed.";
        } else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
          e << "No \"Find" << this->Name << ".cmake\" found in "
            << "CMAKE_MODULE_PATH.";

          aw
            << "Find" << this->Name
            << ".cmake must either be part of this "
               "project itself, in this case adjust CMAKE_MODULE_PATH so that "
               "it points to the correct location inside its source tree.\n"
               "Or it must be installed by a package which has already been "
               "found via find_package().  In this case make sure that "
               "package has indeed been found and adjust CMAKE_MODULE_PATH to "
               "contain the location where that package has installed "
               "Find"
            << this->Name
            << ".cmake.  This must be a location "
               "provided by that package.  This error in general means that "
               "the buildsystem of this project is relying on a Find-module "
               "without ensuring that it is actually available.\n";
        }
      }

      this->Makefile->IssueMessage(this->Required ? MessageType::FATAL_ERROR
                                                  : MessageType::WARNING,
                                   e.str());
      if (this->Required) {
        cmSystemTools::SetFatalErrorOccured();
      }

      if (!aw.str().empty()) {
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, aw.str());
      }
    }
    // output result if in config mode but not in quiet mode
    else if (!this->Quiet) {
      std::ostringstream aw;
      aw << "Could NOT find " << this->Name << " (missing: " << this->Name
         << "_DIR)";
      this->Makefile->DisplayStatus(aw.str(), -1);
    }
  }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found ? "1" : "0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if (found) {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
  } else {
    this->Makefile->RemoveDefinition(fileVar);
  }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for (ConfigFileInfo const& i : this->ConsideredConfigs) {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += i.filename;
    consideredVersions += i.version;
    sep = ";";
  }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}